

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>::
fulfill(AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo> *this
       ,unsigned_long *value)

{
  ExceptionOr<unsigned_long> local_178;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_178.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_178.value.ptr.isSet = true;
    local_178.value.ptr.field_1.value = *value;
    ExceptionOr<unsigned_long>::operator=(&this->result,&local_178);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_178);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }